

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O2

Expression * wasm::Properties::getSignExtValue(Expression *curr)

{
  bool bVar1;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
  local_f8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
  local_b8;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_78;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_50;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_28;
  Expression *local_18;
  Expression *extended;
  int32_t leftShift;
  int32_t rightShift;
  
  if ((curr->type).id == 2) {
    if (curr->_id != UnaryId) {
      local_f8.submatchers.curr.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::AnyKind<int>_> *)&extended;
      extended._0_4_ = 0;
      local_b8.submatchers.curr.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::AnyKind<int>_> *)((long)&extended + 4);
      extended._4_4_ = 0;
      local_28.binder = &local_18;
      local_18 = (Expression *)0x0;
      local_50.submatchers.next.curr = &local_f8;
      local_f8.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
      local_f8.binder = (matched_t<wasm::Const_*> *)0x0;
      local_78.submatchers.curr = &local_50;
      local_50.binder =
           (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> *)0x0;
      local_50.submatchers.curr = &local_28;
      local_50.data = ShlInt32;
      local_78.submatchers.next.curr = &local_b8;
      local_b8.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
      local_b8.binder = (matched_t<wasm::Const_*> *)0x0;
      local_78.binder =
           (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> *)0x0;
      local_78.data = ShrSInt32;
      bVar1 = Match::Internal::
              Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
              ::matches(&local_78,curr);
      if (((!bVar1) || ((int)extended != extended._4_4_)) || ((int)extended == 0)) {
        local_18 = (Expression *)0x0;
      }
      return local_18;
    }
    if (curr[1]._id - TableSizeId < 2) {
      return (Expression *)curr[1].type.id;
    }
  }
  return (Expression *)0x0;
}

Assistant:

bool operator!=(const BasicType& other) const { return id != other; }